

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O2

uint32_t __thiscall
PolygonTriangulation::find_top_inside_trapezoid_index(PolygonTriangulation *this)

{
  pointer pTVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pTVar1 = (this->trapezoids_).
             super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0xffffffff;
    if (((ulong)(((long)(this->trapezoids_).
                        super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28) <= uVar4)
       || (bVar2 = is_top_inside_triangle(this,pTVar1 + uVar4), uVar3 = (uint32_t)uVar4, bVar2))
    break;
    uVar4 = (ulong)((uint32_t)uVar4 + 1);
  }
  return uVar3;
}

Assistant:

uint32_t PolygonTriangulation::find_top_inside_trapezoid_index() const {
  /// @bug : currently outside top triangle can be returned.
  for (uint32_t i = 0u; i < trapezoids_.size(); ++i) {
    const auto& trapezoid = trapezoids_[i];
    if (is_top_inside_triangle(trapezoid)) {
      return i;
    }
  }
  return kInvalidIndex;
}